

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O1

void Kit_DsdPrintCofactors(uint *pTruth,int nVars,int nCofLevel,int fVerbose)

{
  Kit_DsdObj_t KVar1;
  uint *puVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  Kit_DsdNtk_t *pKVar7;
  Kit_DsdNtk_t *pKVar8;
  byte bVar9;
  uint uVar10;
  uint uVar11;
  uint **ppuVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  int iVar21;
  ulong uVar22;
  bool bVar23;
  int piCofVar [5];
  uint *ppCofs [5] [16];
  long local_340;
  uint local_2f8 [8];
  ulong local_2d8;
  ulong local_2d0;
  uint local_2c8;
  uint local_2c4;
  uint *local_2c0;
  uint *local_2b8 [16];
  uint *local_238 [16];
  undefined8 auStack_1b8 [16];
  undefined8 auStack_138 [16];
  undefined8 auStack_b8 [17];
  
  if (4 < nCofLevel) {
    __assert_fail("nCofLevel < 5",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitDsd.c"
                  ,0xafb,"void Kit_DsdPrintCofactors(unsigned int *, int, int, int)");
  }
  pKVar7 = Kit_DsdDecomposeInt(pTruth,nVars,0);
  pKVar8 = Kit_DsdExpand(pKVar7);
  Kit_DsdNtkFree(pKVar7);
  if (fVerbose != 0) {
    Kit_DsdPrint(_stdout,pKVar8);
    putchar(10);
  }
  Kit_DsdNtkFree(pKVar8);
  bVar9 = (byte)(nVars + -5);
  iVar3 = 0x50 << (bVar9 & 0x1f);
  if (nVars < 6) {
    iVar3 = 0x50;
  }
  iVar4 = nVars + -5;
  if (nVars < 6) {
    iVar4 = 0;
  }
  local_2b8[0] = (uint *)malloc((long)iVar3 << 2);
  ppuVar12 = local_2b8;
  lVar17 = 0;
  iVar3 = 0;
  do {
    iVar21 = iVar3;
    lVar18 = 0;
    do {
      ppuVar12[lVar18] = local_2b8[0] + (iVar21 + (int)lVar18 << ((byte)iVar4 & 0x1f));
      lVar18 = lVar18 + 1;
    } while (lVar18 != 0x10);
    lVar17 = lVar17 + 1;
    ppuVar12 = ppuVar12 + 0x10;
    iVar3 = iVar21 + 0x10;
  } while (lVar17 != 5);
  uVar10 = 1 << (bVar9 & 0x1f);
  if (nVars < 6) {
    uVar10 = 1;
  }
  if (iVar21 != 0x40) {
    __assert_fail("nSize == 80",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitDsd.c"
                  ,0xb0c,"void Kit_DsdPrintCofactors(unsigned int *, int, int, int)");
  }
  if (0 < (int)uVar10) {
    lVar17 = (ulong)uVar10 + 1;
    do {
      local_2b8[0][lVar17 + -2] = pTruth[lVar17 + -2];
      lVar17 = lVar17 + -1;
    } while (1 < lVar17);
  }
  local_2c0 = local_2b8[0];
  switch(nCofLevel) {
  case 1:
    if (0 < nVars) {
      uVar10 = 0;
      do {
        printf("    Variables { ");
        printf("%c ",(ulong)(uVar10 + 0x61));
        puts("}");
        puVar2 = local_2c0;
        Kit_TruthCofactor0New(local_238[0],local_2c0,nVars,uVar10);
        Kit_TruthCofactor1New(local_238[1],puVar2,nVars,uVar10);
        uVar6 = 0;
        uVar19 = 0;
        uVar22 = 0;
        do {
          puVar2 = local_238[uVar19];
          pKVar7 = Kit_DsdDecomposeInt(puVar2,nVars,0);
          pKVar8 = Kit_DsdExpand(pKVar7);
          Kit_DsdNtkFree(pKVar7);
          if (fVerbose != 0) {
            printf("Cof%d%d: ",1,uVar19 & 0xffffffff);
            Kit_DsdPrint(_stdout,pKVar8);
            putchar(10);
          }
          if ((ulong)pKVar8->nNodes == 0) {
            uVar5 = 0;
          }
          else {
            uVar13 = 0;
            uVar5 = 0;
            do {
              if (pKVar8->pNodes[uVar13] == (Kit_DsdObj_t *)0x0) break;
              KVar1 = *pKVar8->pNodes[uVar13];
              uVar11 = (uint)KVar1 >> 0x1a;
              if (uVar11 < uVar5) {
                uVar11 = uVar5;
              }
              if (((uint)KVar1 & 0x1c0) == 0x140) {
                uVar5 = uVar11;
              }
              uVar13 = uVar13 + 1;
            } while (pKVar8->nNodes != uVar13);
          }
          uVar13 = (ulong)uVar5;
          if (uVar5 < (uint)uVar22) {
            uVar13 = uVar22;
          }
          Kit_DsdNtkFree(pKVar8);
          iVar3 = Kit_TruthSupportSize(puVar2,nVars);
          uVar6 = uVar6 + iVar3;
          bVar23 = uVar19 == 0;
          uVar19 = uVar19 + 1;
          uVar22 = uVar13;
        } while (bVar23);
        printf("Max = %2d. Supps = %2d.\n",uVar13,(ulong)uVar6);
        uVar6 = uVar10 + 1;
        local_2f8[0] = uVar10;
        uVar10 = uVar6;
      } while (uVar6 != nVars);
    }
    if (nCofLevel == 4) goto switchD_005d3e0f_caseD_4;
    if (nCofLevel != 3) {
      if (nCofLevel != 2) goto switchD_005d3e0f_default;
      goto switchD_005d3e0f_caseD_2;
    }
    break;
  case 2:
switchD_005d3e0f_caseD_2:
    if (0 < nVars) {
      uVar19 = 0;
      do {
        uVar6 = (int)uVar19 + 1;
        uVar10 = uVar6;
        local_2d8 = uVar19;
        if ((int)uVar6 < nVars) {
          do {
            local_2f8[0] = (uint)local_2d8;
            local_2f8[1] = uVar10;
            printf("    Variables { ");
            lVar17 = 0;
            do {
              printf("%c ",(ulong)(local_2f8[lVar17] + 0x61));
              lVar17 = lVar17 + 1;
            } while (lVar17 == 1);
            puts("}");
            local_340 = 1;
            do {
              ppuVar12 = local_2b8;
              lVar17 = 0;
              do {
                lVar18 = lVar17 + 1;
                uVar5 = local_2f8[lVar17];
                lVar20 = 0x40;
                uVar11 = 1;
                do {
                  puVar2 = *(uint **)((long)ppuVar12 + lVar20 + -0x40);
                  Kit_TruthCofactor0New(*(uint **)((long)ppuVar12 + lVar20 * 2),puVar2,nVars,uVar5);
                  Kit_TruthCofactor1New
                            (*(uint **)((long)ppuVar12 + lVar20 * 2 + 8),puVar2,nVars,uVar5);
                  lVar20 = lVar20 + 8;
                  uVar14 = uVar11 >> ((byte)lVar17 & 0x1f);
                  uVar11 = uVar11 + 1;
                } while (uVar14 == 0);
                ppuVar12 = ppuVar12 + 0x10;
                lVar17 = lVar18;
              } while (lVar18 != local_340);
              local_340 = local_340 + 1;
            } while (local_340 != 3);
            uVar19 = 0;
            uVar11 = 0;
            uVar5 = 0;
            do {
              puVar2 = (uint *)auStack_1b8[uVar19];
              pKVar7 = Kit_DsdDecomposeInt(puVar2,nVars,0);
              pKVar8 = Kit_DsdExpand(pKVar7);
              Kit_DsdNtkFree(pKVar7);
              if (fVerbose != 0) {
                printf("Cof%d%d: ",2,uVar19 & 0xffffffff);
                Kit_DsdPrint(_stdout,pKVar8);
                putchar(10);
              }
              if ((ulong)pKVar8->nNodes == 0) {
                uVar14 = 0;
              }
              else {
                uVar22 = 0;
                uVar14 = 0;
                do {
                  if (pKVar8->pNodes[uVar22] == (Kit_DsdObj_t *)0x0) break;
                  KVar1 = *pKVar8->pNodes[uVar22];
                  uVar15 = (uint)KVar1 >> 0x1a;
                  if (uVar15 < uVar14) {
                    uVar15 = uVar14;
                  }
                  if (((uint)KVar1 & 0x1c0) == 0x140) {
                    uVar14 = uVar15;
                  }
                  uVar22 = uVar22 + 1;
                } while (pKVar8->nNodes != uVar22);
              }
              if (uVar14 < uVar5) {
                uVar14 = uVar5;
              }
              uVar5 = uVar14;
              Kit_DsdNtkFree(pKVar8);
              iVar3 = Kit_TruthSupportSize(puVar2,nVars);
              uVar11 = uVar11 + iVar3;
              uVar19 = uVar19 + 1;
            } while (uVar19 != 4);
            printf("Max = %2d. Supps = %2d.\n",(ulong)uVar5,(ulong)uVar11);
            uVar10 = uVar10 + 1;
          } while (uVar10 != nVars);
        }
        uVar19 = (ulong)uVar6;
      } while (uVar6 != nVars);
    }
    if (nCofLevel == 4) goto switchD_005d3e0f_caseD_4;
    if (nCofLevel != 3) goto switchD_005d3e0f_default;
    break;
  case 3:
    break;
  case 4:
switchD_005d3e0f_caseD_4:
    if (nVars < 1) goto switchD_005d3e0f_default;
    goto LAB_005d44a2;
  default:
    goto switchD_005d3e0f_default;
  }
  if (0 < nVars) {
    uVar10 = 0;
    do {
      uVar5 = uVar10 + 1;
      uVar6 = uVar5;
      if ((int)uVar5 < nVars) {
        do {
          local_2d8 = (ulong)uVar6;
          iVar3 = uVar6 + 1;
          local_2d0 = CONCAT44(local_2d0._4_4_,iVar3);
          for (; iVar3 < nVars; iVar3 = iVar3 + 1) {
            local_2f8[1] = (uint)local_2d8;
            local_2f8[0] = uVar10;
            local_2f8[2] = iVar3;
            printf("    Variables { ");
            lVar17 = 0;
            do {
              printf("%c ",(ulong)(local_2f8[lVar17] + 0x61));
              lVar17 = lVar17 + 1;
            } while (lVar17 != 3);
            puts("}");
            local_340 = 1;
            do {
              ppuVar12 = local_2b8;
              lVar17 = 0;
              do {
                lVar18 = lVar17 + 1;
                uVar6 = local_2f8[lVar17];
                lVar20 = 0x44;
                uVar11 = 1;
                do {
                  puVar2 = *(uint **)((long)ppuVar12 + lVar20 + -0x44);
                  Kit_TruthCofactor0New
                            (*(uint **)((long)ppuVar12 + lVar20 * 2 + -8),puVar2,nVars,uVar6);
                  Kit_TruthCofactor1New(*(uint **)((long)ppuVar12 + lVar20 * 2),puVar2,nVars,uVar6);
                  lVar20 = lVar20 + 8;
                  uVar14 = uVar11 >> ((byte)lVar17 & 0x1f);
                  uVar11 = uVar11 + 1;
                } while (uVar14 == 0);
                ppuVar12 = ppuVar12 + 0x10;
                lVar17 = lVar18;
              } while (lVar18 != local_340);
              local_340 = local_340 + 1;
            } while (local_340 != 4);
            uVar19 = 0;
            uVar6 = 0;
            uVar11 = 0;
            do {
              puVar2 = (uint *)auStack_138[uVar19];
              pKVar7 = Kit_DsdDecomposeInt(puVar2,nVars,0);
              pKVar8 = Kit_DsdExpand(pKVar7);
              Kit_DsdNtkFree(pKVar7);
              if (fVerbose != 0) {
                printf("Cof%d%d: ",3,uVar19 & 0xffffffff);
                Kit_DsdPrint(_stdout,pKVar8);
                putchar(10);
              }
              if ((ulong)pKVar8->nNodes == 0) {
                uVar14 = 0;
              }
              else {
                uVar22 = 0;
                uVar14 = 0;
                do {
                  if (pKVar8->pNodes[uVar22] == (Kit_DsdObj_t *)0x0) break;
                  KVar1 = *pKVar8->pNodes[uVar22];
                  uVar15 = (uint)KVar1 >> 0x1a;
                  if (uVar15 < uVar14) {
                    uVar15 = uVar14;
                  }
                  if (((uint)KVar1 & 0x1c0) == 0x140) {
                    uVar14 = uVar15;
                  }
                  uVar22 = uVar22 + 1;
                } while (pKVar8->nNodes != uVar22);
              }
              if (uVar14 < uVar11) {
                uVar14 = uVar11;
              }
              uVar11 = uVar14;
              Kit_DsdNtkFree(pKVar8);
              iVar4 = Kit_TruthSupportSize(puVar2,nVars);
              uVar6 = uVar6 + iVar4;
              uVar19 = uVar19 + 1;
            } while (uVar19 != 8);
            printf("Max = %2d. Supps = %2d.\n",(ulong)uVar11,(ulong)uVar6);
          }
          uVar6 = (uint)local_2d0;
        } while ((uint)local_2d0 != nVars);
      }
      uVar10 = uVar5;
    } while (uVar5 != nVars);
  }
  if (nCofLevel == 4 && 0 < nVars) {
LAB_005d44a2:
    local_2c8 = 1;
    if (1 < nVars) {
      local_2c8 = nVars;
    }
    local_2c4 = 0;
    do {
      local_2d0 = (ulong)local_2c4;
      local_2c4 = local_2c4 + 1;
      uVar10 = local_2c4;
      if ((int)local_2c4 < nVars) {
        do {
          uVar5 = uVar10 + 1;
          uVar6 = uVar5;
          while ((int)uVar6 < nVars) {
            local_2d8 = (ulong)uVar6;
            uVar6 = uVar6 + 1;
            for (uVar11 = uVar6; (int)uVar11 < nVars; uVar11 = uVar11 + 1) {
              local_2f8[0] = (uint)local_2d0;
              local_2f8[2] = (uint)local_2d8;
              local_2f8[1] = uVar10;
              local_2f8[3] = uVar11;
              printf("    Variables { ");
              lVar17 = 0;
              do {
                printf("%c ",(ulong)(local_2f8[lVar17] + 0x61));
                lVar17 = lVar17 + 1;
              } while (lVar17 != 4);
              puts("}");
              local_340 = 1;
              do {
                ppuVar12 = local_2b8;
                lVar17 = 0;
                do {
                  lVar18 = lVar17 + 1;
                  uVar14 = local_2f8[lVar17];
                  lVar20 = 0x44;
                  uVar15 = 1;
                  do {
                    puVar2 = *(uint **)((long)ppuVar12 + lVar20 + -0x44);
                    Kit_TruthCofactor0New
                              (*(uint **)((long)ppuVar12 + lVar20 * 2 + -8),puVar2,nVars,uVar14);
                    Kit_TruthCofactor1New
                              (*(uint **)((long)ppuVar12 + lVar20 * 2),puVar2,nVars,uVar14);
                    lVar20 = lVar20 + 8;
                    uVar16 = uVar15 >> ((byte)lVar17 & 0x1f);
                    uVar15 = uVar15 + 1;
                  } while (uVar16 == 0);
                  ppuVar12 = ppuVar12 + 0x10;
                  lVar17 = lVar18;
                } while (lVar18 != local_340);
                local_340 = local_340 + 1;
              } while (local_340 != 5);
              uVar22 = 0;
              uVar14 = 0;
              uVar19 = 0;
              do {
                puVar2 = (uint *)auStack_b8[uVar22];
                pKVar7 = Kit_DsdDecomposeInt(puVar2,nVars,0);
                pKVar8 = Kit_DsdExpand(pKVar7);
                Kit_DsdNtkFree(pKVar7);
                if (fVerbose != 0) {
                  printf("Cof%d%d: ",4,uVar22 & 0xffffffff);
                  Kit_DsdPrint(_stdout,pKVar8);
                  putchar(10);
                }
                if ((ulong)pKVar8->nNodes == 0) {
                  uVar15 = 0;
                }
                else {
                  uVar13 = 0;
                  uVar15 = 0;
                  do {
                    if (pKVar8->pNodes[uVar13] == (Kit_DsdObj_t *)0x0) break;
                    KVar1 = *pKVar8->pNodes[uVar13];
                    uVar16 = (uint)KVar1 >> 0x1a;
                    if (uVar16 < uVar15) {
                      uVar16 = uVar15;
                    }
                    if (((uint)KVar1 & 0x1c0) == 0x140) {
                      uVar15 = uVar16;
                    }
                    uVar13 = uVar13 + 1;
                  } while (pKVar8->nNodes != uVar13);
                }
                uVar13 = (ulong)uVar15;
                if (uVar15 < (uint)uVar19) {
                  uVar13 = uVar19;
                }
                Kit_DsdNtkFree(pKVar8);
                iVar3 = Kit_TruthSupportSize(puVar2,nVars);
                uVar14 = uVar14 + iVar3;
                uVar22 = uVar22 + 1;
                uVar19 = uVar13;
              } while (uVar22 != 0x10);
              printf("Max = %2d. Supps = %2d.\n",uVar13,(ulong)uVar14);
            }
          }
          uVar10 = uVar5;
        } while (uVar5 != nVars);
      }
    } while (local_2c4 != local_2c8);
  }
switchD_005d3e0f_default:
  if (local_2c0 != (uint *)0x0) {
    free(local_2c0);
  }
  return;
}

Assistant:

void Kit_DsdPrintCofactors( unsigned * pTruth, int nVars, int nCofLevel, int fVerbose )
{
    Kit_DsdNtk_t * ppNtks[32] = {0}, * pTemp;
    unsigned * ppCofs[5][16];
    int piCofVar[5];
    int nPrimeSizeMax, nPrimeSizeCur, nSuppSizeMax;
    int i, k, v1, v2, v3, v4, s, nSteps, nSize, nMemSize;
    assert( nCofLevel < 5 );

    // print the function
    ppNtks[0] = Kit_DsdDecompose( pTruth, nVars );
    ppNtks[0] = Kit_DsdExpand( pTemp = ppNtks[0] );
    Kit_DsdNtkFree( pTemp );
    if ( fVerbose )
        Kit_DsdPrint( stdout, ppNtks[0] ), printf( "\n" );
    Kit_DsdNtkFree( ppNtks[0] );

    // allocate storage for cofactors
    nMemSize = Kit_TruthWordNum(nVars);
    ppCofs[0][0] = ABC_ALLOC( unsigned, 80 * nMemSize );
    nSize = 0;
    for ( i = 0; i <  5; i++ )
    for ( k = 0; k < 16; k++ )
        ppCofs[i][k] = ppCofs[0][0] + nMemSize * nSize++;
    assert( nSize == 80 );

    // copy the function
    Kit_TruthCopy( ppCofs[0][0], pTruth, nVars );

    if ( nCofLevel == 1 )
    for ( v1 = 0; v1 < nVars; v1++ )
    {
        nSteps = 0;
        piCofVar[nSteps++] = v1;

        printf( "    Variables { " );
        for ( i = 0; i < nSteps; i++ )
            printf( "%c ", 'a' + piCofVar[i] );
        printf( "}\n" );

        // single cofactors
        for ( s = 1; s <= nSteps; s++ )
        {
            for ( k = 0; k < s; k++ )
            {
                nSize = (1 << k);
                for ( i = 0; i < nSize; i++ )
                {
                    Kit_TruthCofactor0New( ppCofs[k+1][2*i+0], ppCofs[k][i], nVars, piCofVar[k] );
                    Kit_TruthCofactor1New( ppCofs[k+1][2*i+1], ppCofs[k][i], nVars, piCofVar[k] );
                }
            }
        }
        // compute DSD networks
        nSize = (1 << nSteps);
        nPrimeSizeMax = 0;
        nSuppSizeMax = 0;
        for ( i = 0; i < nSize; i++ )
        {
            ppNtks[i] = Kit_DsdDecompose( ppCofs[nSteps][i], nVars );
            ppNtks[i] = Kit_DsdExpand( pTemp = ppNtks[i] );
            Kit_DsdNtkFree( pTemp );
            if ( fVerbose )
            {
                printf( "Cof%d%d: ", nSteps, i );
                Kit_DsdPrint( stdout, ppNtks[i] ), printf( "\n" );
            }
            // compute the largest non-decomp block
            nPrimeSizeCur  = Kit_DsdNonDsdSizeMax(ppNtks[i]);
            nPrimeSizeMax  = KIT_MAX( nPrimeSizeMax, nPrimeSizeCur );
            Kit_DsdNtkFree( ppNtks[i] );
            nSuppSizeMax += Kit_TruthSupportSize( ppCofs[nSteps][i], nVars );
        }
        printf( "Max = %2d. Supps = %2d.\n", nPrimeSizeMax, nSuppSizeMax );
    }

    if ( nCofLevel == 2 )
    for ( v1 = 0; v1 < nVars; v1++ )
    for ( v2 = v1+1; v2 < nVars; v2++ )
    {
        nSteps = 0;
        piCofVar[nSteps++] = v1;
        piCofVar[nSteps++] = v2;

        printf( "    Variables { " );
        for ( i = 0; i < nSteps; i++ )
            printf( "%c ", 'a' + piCofVar[i] );
        printf( "}\n" );

        // single cofactors
        for ( s = 1; s <= nSteps; s++ )
        {
            for ( k = 0; k < s; k++ )
            {
                nSize = (1 << k);
                for ( i = 0; i < nSize; i++ )
                {
                    Kit_TruthCofactor0New( ppCofs[k+1][2*i+0], ppCofs[k][i], nVars, piCofVar[k] );
                    Kit_TruthCofactor1New( ppCofs[k+1][2*i+1], ppCofs[k][i], nVars, piCofVar[k] );
                }
            }
        }
        // compute DSD networks
        nSize = (1 << nSteps);
        nPrimeSizeMax = 0;
        nSuppSizeMax = 0;
        for ( i = 0; i < nSize; i++ )
        {
            ppNtks[i] = Kit_DsdDecompose( ppCofs[nSteps][i], nVars );
            ppNtks[i] = Kit_DsdExpand( pTemp = ppNtks[i] );
            Kit_DsdNtkFree( pTemp );
            if ( fVerbose )
            {
                printf( "Cof%d%d: ", nSteps, i );
                Kit_DsdPrint( stdout, ppNtks[i] ), printf( "\n" );
            }
            // compute the largest non-decomp block
            nPrimeSizeCur  = Kit_DsdNonDsdSizeMax(ppNtks[i]);
            nPrimeSizeMax  = KIT_MAX( nPrimeSizeMax, nPrimeSizeCur );
            Kit_DsdNtkFree( ppNtks[i] );
            nSuppSizeMax += Kit_TruthSupportSize( ppCofs[nSteps][i], nVars );
        }
        printf( "Max = %2d. Supps = %2d.\n", nPrimeSizeMax, nSuppSizeMax );
    }

    if ( nCofLevel == 3 )
    for ( v1 = 0; v1 < nVars; v1++ )
    for ( v2 = v1+1; v2 < nVars; v2++ )
    for ( v3 = v2+1; v3 < nVars; v3++ )
    {
        nSteps = 0;
        piCofVar[nSteps++] = v1;
        piCofVar[nSteps++] = v2;
        piCofVar[nSteps++] = v3;

        printf( "    Variables { " );
        for ( i = 0; i < nSteps; i++ )
            printf( "%c ", 'a' + piCofVar[i] );
        printf( "}\n" );

        // single cofactors
        for ( s = 1; s <= nSteps; s++ )
        {
            for ( k = 0; k < s; k++ )
            {
                nSize = (1 << k);
                for ( i = 0; i < nSize; i++ )
                {
                    Kit_TruthCofactor0New( ppCofs[k+1][2*i+0], ppCofs[k][i], nVars, piCofVar[k] );
                    Kit_TruthCofactor1New( ppCofs[k+1][2*i+1], ppCofs[k][i], nVars, piCofVar[k] );
                }
            }
        }
        // compute DSD networks
        nSize = (1 << nSteps);
        nPrimeSizeMax = 0;
        nSuppSizeMax = 0;
        for ( i = 0; i < nSize; i++ )
        {
            ppNtks[i] = Kit_DsdDecompose( ppCofs[nSteps][i], nVars );
            ppNtks[i] = Kit_DsdExpand( pTemp = ppNtks[i] );
            Kit_DsdNtkFree( pTemp );
            if ( fVerbose )
            {
                printf( "Cof%d%d: ", nSteps, i );
                Kit_DsdPrint( stdout, ppNtks[i] ), printf( "\n" );
            }
            // compute the largest non-decomp block
            nPrimeSizeCur  = Kit_DsdNonDsdSizeMax(ppNtks[i]);
            nPrimeSizeMax  = KIT_MAX( nPrimeSizeMax, nPrimeSizeCur );
            Kit_DsdNtkFree( ppNtks[i] );
            nSuppSizeMax += Kit_TruthSupportSize( ppCofs[nSteps][i], nVars );
        }
        printf( "Max = %2d. Supps = %2d.\n", nPrimeSizeMax, nSuppSizeMax );
    }

    if ( nCofLevel == 4 )
    for ( v1 = 0; v1 < nVars; v1++ )
    for ( v2 = v1+1; v2 < nVars; v2++ )
    for ( v3 = v2+1; v3 < nVars; v3++ )
    for ( v4 = v3+1; v4 < nVars; v4++ )
    {
        nSteps = 0;
        piCofVar[nSteps++] = v1;
        piCofVar[nSteps++] = v2;
        piCofVar[nSteps++] = v3;
        piCofVar[nSteps++] = v4;

        printf( "    Variables { " );
        for ( i = 0; i < nSteps; i++ )
            printf( "%c ", 'a' + piCofVar[i] );
        printf( "}\n" );

        // single cofactors
        for ( s = 1; s <= nSteps; s++ )
        {
            for ( k = 0; k < s; k++ )
            {
                nSize = (1 << k);
                for ( i = 0; i < nSize; i++ )
                {
                    Kit_TruthCofactor0New( ppCofs[k+1][2*i+0], ppCofs[k][i], nVars, piCofVar[k] );
                    Kit_TruthCofactor1New( ppCofs[k+1][2*i+1], ppCofs[k][i], nVars, piCofVar[k] );
                }
            }
        }
        // compute DSD networks
        nSize = (1 << nSteps);
        nPrimeSizeMax = 0;
        nSuppSizeMax = 0;
        for ( i = 0; i < nSize; i++ )
        {
            ppNtks[i] = Kit_DsdDecompose( ppCofs[nSteps][i], nVars );
            ppNtks[i] = Kit_DsdExpand( pTemp = ppNtks[i] );
            Kit_DsdNtkFree( pTemp );
            if ( fVerbose )
            {
                printf( "Cof%d%d: ", nSteps, i );
                Kit_DsdPrint( stdout, ppNtks[i] ), printf( "\n" );
            }
            // compute the largest non-decomp block
            nPrimeSizeCur  = Kit_DsdNonDsdSizeMax(ppNtks[i]);
            nPrimeSizeMax  = KIT_MAX( nPrimeSizeMax, nPrimeSizeCur );
            Kit_DsdNtkFree( ppNtks[i] );
            nSuppSizeMax += Kit_TruthSupportSize( ppCofs[nSteps][i], nVars );
        }
        printf( "Max = %2d. Supps = %2d.\n", nPrimeSizeMax, nSuppSizeMax );
    }


    ABC_FREE( ppCofs[0][0] );
}